

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::BuildEmpty(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
  *pSVar1;
  Func *pFVar2;
  code *pcVar3;
  byte bVar4;
  bool bVar5;
  RegSlot RVar6;
  uint uVar7;
  LabelInstr *branchTarget;
  Type *pTVar8;
  bool *pbVar9;
  BranchInstr *pBVar10;
  uint *puVar11;
  undefined4 *puVar12;
  IntConstOpnd *pIVar13;
  JITTimeFunctionBody *pJVar14;
  RegOpnd *pRVar15;
  Instr *pIVar16;
  RegOpnd *pRVar17;
  RegOpnd *src2Opnd;
  undefined6 in_register_00000032;
  int iVar18;
  
  Js::ByteCodeReader::Empty(&this->m_jnReader);
  iVar18 = (int)CONCAT62(in_register_00000032,newOpcode);
  branchTarget = (LabelInstr *)IR::Instr::New(newOpcode,this->m_func);
  if (iVar18 < 0xea) {
    if (iVar18 == 8) {
      bVar5 = Func::IsJitInDebugMode(this->m_func);
      if (bVar5) {
        InsertBailOutForDebugger(this,offset,BailOutExplicit,(Instr *)0x0);
        return;
      }
      goto LAB_004cc7e7;
    }
    if (iVar18 == 0x24) {
      pRVar15 = BuildDstOpnd(this,0,TyVar,false,false);
      if ((branchTarget->super_Instr).m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar5) goto LAB_004ccabe;
        *puVar12 = 0;
      }
      pFVar2 = (branchTarget->super_Instr).m_func;
      if ((pRVar15->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar5) goto LAB_004ccabe;
        *puVar12 = 0;
      }
      bVar4 = (pRVar15->super_Opnd).field_0xb;
      if ((bVar4 & 2) != 0) {
        pRVar15 = (RegOpnd *)IR::Opnd::Copy(&pRVar15->super_Opnd,pFVar2);
        bVar4 = (pRVar15->super_Opnd).field_0xb;
      }
      (pRVar15->super_Opnd).field_0xb = bVar4 | 2;
      (branchTarget->super_Instr).m_src1 = &pRVar15->super_Opnd;
      goto LAB_004cc7e7;
    }
    if (iVar18 != 0xdc) goto LAB_004cc7e7;
    pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar6 = JITTimeFunctionBody::GetLocalClosureReg(pJVar14);
    pRVar15 = BuildSrcOpnd(this,RVar6,TyVar);
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    pRVar17 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar16 = IR::Instr::New(LdFuncExpr,&pRVar17->super_Opnd,this->m_func);
    AddInstr(this,pIVar16,offset);
    pBVar10 = IR::BranchInstr::New
                        (BrFncCachedScopeNeq,branchTarget,&pRVar17->super_Opnd,&pRVar15->super_Opnd,
                         this->m_func);
    AddInstr(this,&pBVar10->super_Instr,offset);
    pIVar16 = IR::Instr::New(CommitScope,this->m_func);
    if (pIVar16->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_004ccabe;
      *puVar12 = 0;
    }
    pFVar2 = pIVar16->m_func;
    if ((pRVar15->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) goto LAB_004ccabe;
      *puVar12 = 0;
    }
    bVar4 = (pRVar15->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      pRVar15 = (RegOpnd *)IR::Opnd::Copy(&pRVar15->super_Opnd,pFVar2);
      bVar4 = (pRVar15->super_Opnd).field_0xb;
    }
    (pRVar15->super_Opnd).field_0xb = bVar4 | 2;
    pIVar16->m_src1 = &pRVar15->super_Opnd;
    AddInstr(this,pIVar16,offset);
  }
  else {
    if (0x16f < iVar18) {
      if (iVar18 == 0x170) {
        pSVar1 = this->handlerOffsetStack;
        if (pSVar1 != (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                       *)0x0) {
          if ((SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
               *)(pSVar1->
                 super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                 ).super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar12 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1ba4,"(!this->handlerOffsetStack->Empty())",
                               "!this->handlerOffsetStack->Empty()");
            if (!bVar5) goto LAB_004ccabe;
            *puVar12 = 0;
          }
          pTVar8 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                   ::Head(&this->handlerOffsetStack->
                           super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                         );
          pbVar9 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::Second(pTVar8);
          if (*pbVar9 != false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar12 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1ba5,"(this->handlerOffsetStack->Top().Second() == false)",
                               "this->handlerOffsetStack->Top().Second() == false");
            if (!bVar5) goto LAB_004ccabe;
            *puVar12 = 0;
          }
          pSVar1 = this->handlerOffsetStack;
          SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
          ::Head(&pSVar1->
                  super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                );
          SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
          ::RemoveHead(&pSVar1->
                        super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                       ,pSVar1->allocator);
        }
        this->finallyBlockLevel = this->finallyBlockLevel + 1;
        branchTarget = (LabelInstr *)IR::Instr::New(Finally,this->m_func);
        goto LAB_004cc7e7;
      }
      if (iVar18 != 0x181) goto LAB_004cc7e7;
      if (this->m_paramScopeDone == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x1bbe,"(!this->IsParamScopeDone())","!this->IsParamScopeDone()");
        if (!bVar5) goto LAB_004ccabe;
        *puVar12 = 0;
      }
      this->m_paramScopeDone = true;
      pFVar2 = this->m_func;
      if (pFVar2->m_localClosureSym == (StackSym *)0x0) {
        pJVar14 = JITTimeWorkItem::GetJITFunctionBody(pFVar2->m_workItem);
        uVar7 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar14);
        if (uVar7 == 0) {
          pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
          bVar5 = JITTimeFunctionBody::HasScopeObject(pJVar14);
          if (bVar5) goto LAB_004cc828;
        }
        else {
LAB_004cc828:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1bc8,
                             "(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject())"
                             ,
                             "this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject()"
                            );
          if (!bVar5) {
LAB_004ccabe:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar12 = 0;
        }
        pIVar13 = IR::IntConstOpnd::New(0,TyVar,this->m_func,false);
      }
      else {
        pIVar13 = (IntConstOpnd *)IR::RegOpnd::New(pFVar2->m_localClosureSym,TyVar,pFVar2);
      }
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar6 = JITTimeFunctionBody::GetParamClosureReg(pJVar14);
      pRVar15 = BuildDstOpnd(this,RVar6,TyVar,false,false);
      pIVar16 = IR::Instr::New(Ld_A,&pRVar15->super_Opnd,&pIVar13->super_Opnd,this->m_func);
      AddInstr(this,pIVar16,offset);
      iVar18 = (int)pIVar16;
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar7 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar14);
      if (uVar7 == 0) {
        pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        bVar5 = JITTimeFunctionBody::HasScopeObject(pJVar14);
        if (!bVar5) {
          return;
        }
      }
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      bVar5 = JITTimeFunctionBody::HasScopeObject(pJVar14);
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      if (bVar5) {
        bVar5 = JITTimeFunctionBody::HasCachedScopePropIds(pJVar14);
        if (bVar5) {
          BuildInitCachedScope(this,iVar18,-1);
          goto LAB_004cc9ff;
        }
        pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar6 = JITTimeFunctionBody::GetLocalClosureReg(pJVar14);
        pRVar15 = BuildDstOpnd(this,RVar6,TyVar,false,false);
        pIVar16 = IR::Instr::New(NewScopeObject,&pRVar15->super_Opnd,this->m_func);
      }
      else {
        RVar6 = JITTimeFunctionBody::GetLocalClosureReg(pJVar14);
        pRVar15 = BuildDstOpnd(this,RVar6,TyVar,false,false);
        pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        uVar7 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar14);
        pIVar13 = IR::IntConstOpnd::New((ulong)(uVar7 + 2),TyUint32,this->m_func,false);
        pIVar16 = IR::Instr::New(NewScopeSlots,&pRVar15->super_Opnd,&pIVar13->super_Opnd,
                                 this->m_func);
      }
      AddInstr(this,pIVar16,0xffffffff);
LAB_004cc9ff:
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar6 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar14);
      pRVar15 = BuildDstOpnd(this,RVar6,TyVar,false,false);
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar6 = JITTimeFunctionBody::GetLocalClosureReg(pJVar14);
      pRVar17 = BuildDstOpnd(this,RVar6,TyVar,false,false);
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar6 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar14);
      src2Opnd = BuildDstOpnd(this,RVar6,TyVar,false,false);
      pIVar16 = IR::Instr::New(LdFrameDisplay,&pRVar15->super_Opnd,&pRVar17->super_Opnd,
                               &src2Opnd->super_Opnd,this->m_func);
      AddInstr(this,pIVar16,0xffffffff);
      pIVar16->field_0x38 = pIVar16->field_0x38 | 4;
      return;
    }
    if (iVar18 == 0xea) {
      this->finallyBlockLevel = this->finallyBlockLevel - 1;
      goto LAB_004cc7e7;
    }
    if (iVar18 != 0xeb) goto LAB_004cc7e7;
    pSVar1 = this->handlerOffsetStack;
    if ((pSVar1 != (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0) &&
       ((SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
         *)(pSVar1->
           super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
           ).super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar1)) {
      pTVar8 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
               ::Head(&pSVar1->
                       super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                     );
      pbVar9 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::Second(pTVar8);
      if (*pbVar9 == true) {
        pBVar10 = IR::BranchInstr::New(BrOnException,(LabelInstr *)0x0,this->m_func);
        pTVar8 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                 ::Head(&this->handlerOffsetStack->
                         super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                       );
        puVar11 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::First(pTVar8);
        AddBranchInstr(this,pBVar10,offset,*puVar11);
      }
    }
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    pBVar10 = IR::BranchInstr::New(Leave,branchTarget,this->m_func);
    AddInstr(this,&pBVar10->super_Instr,offset);
  }
  offset = 0xffffffff;
LAB_004cc7e7:
  AddInstr(this,&branchTarget->super_Instr,offset);
  return;
}

Assistant:

void
IRBuilder::BuildEmpty(Js::OpCode newOpcode, uint32 offset)
{
    IR::Instr *instr;

    m_jnReader.Empty();

    instr = IR::Instr::New(newOpcode, m_func);

    switch (newOpcode)
    {
    case Js::OpCode::CommitScope:
    {
        IR::RegOpnd *   src1Opnd;

        src1Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());

        IR::LabelInstr *labelNull = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

        IR::RegOpnd * funcExprOpnd = IR::RegOpnd::New(TyVar, m_func);
        instr = IR::Instr::New(Js::OpCode::LdFuncExpr, funcExprOpnd, m_func);
        this->AddInstr(instr, offset);

        IR::BranchInstr *branchInstr = IR::BranchInstr::New(Js::OpCode::BrFncCachedScopeNeq, labelNull,
            funcExprOpnd, src1Opnd, this->m_func);
        this->AddInstr(branchInstr, offset);

        instr = IR::Instr::New(newOpcode, this->m_func);
        instr->SetSrc1(src1Opnd);

        this->AddInstr(instr, offset);

        this->AddInstr(labelNull, Js::Constants::NoByteCodeOffset);
        return;
    }
    case Js::OpCode::Ret:
    {
        IR::RegOpnd *regOpnd = BuildDstOpnd(0);
        instr->SetSrc1(regOpnd);
        this->AddInstr(instr, offset);
        break;
    }

    case Js::OpCode::Leave:
    {
        IR::BranchInstr * branchInstr;
        IR::LabelInstr * labelInstr;

        if (this->handlerOffsetStack && !this->handlerOffsetStack->Empty() && this->handlerOffsetStack->Top().Second())
        {
            // If the try region has a break block, we don't want the Flowgraph to move all of that code out of the loop
            // because an exception will bring the control back into the loop. The branch out of the loop (which is the
            // reason for the code to be a break block) can still be moved out though.
            //
            // "BrOnException $catch" is inserted before Leave's in the try region to instrument flow from the try region
            // to the catch region (which is in the loop).
            IR::BranchInstr * brOnException = IR::BranchInstr::New(Js::OpCode::BrOnException, nullptr, this->m_func);
            this->AddBranchInstr(brOnException, offset, this->handlerOffsetStack->Top().First());
        }

        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        branchInstr = IR::BranchInstr::New(newOpcode, labelInstr, this->m_func);
        this->AddInstr(branchInstr, offset);
        this->AddInstr(labelInstr, Js::Constants::NoByteCodeOffset);
        break;
    }

    case Js::OpCode::LeaveNull:
        finallyBlockLevel--;
        this->AddInstr(instr, offset);
        break;

    case Js::OpCode::Finally:
        if (this->handlerOffsetStack)
        {
            AssertOrFailFast(!this->handlerOffsetStack->Empty());
            AssertOrFailFast(this->handlerOffsetStack->Top().Second() == false);
            this->handlerOffsetStack->Pop();
        }
        finallyBlockLevel++;
        this->AddInstr(IR::Instr::New(Js::OpCode::Finally, this->m_func), offset);
        break;

    case Js::OpCode::Break:
        if (m_func->IsJitInDebugMode())
        {
            // Add explicit bailout.
            this->InsertBailOutForDebugger(offset, IR::BailOutExplicit);
        }
        else
        {
            // Default behavior, let's keep it for now, removed in lowerer.
            this->AddInstr(instr, offset);
        }
        break;

    case Js::OpCode::BeginBodyScope:
    {
        // This marks the end of a param scope which is not merged with body scope.
        // So we have to first cache the closure so that we can use it to copy the initial values for
        // body syms from corresponding param syms (LdParamSlot). Body should get its own scope slot.
        Assert(!this->IsParamScopeDone());
        this->SetParamScopeDone();

        IR::Opnd * localClosureOpnd;
        if (this->m_func->GetLocalClosureSym() != nullptr)
        {
            localClosureOpnd = IR::RegOpnd::New(this->m_func->GetLocalClosureSym(), TyVar, this->m_func);
        }
        else
        {
            AssertOrFailFast(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject());
            localClosureOpnd = IR::IntConstOpnd::New(0, TyVar, this->m_func);
        }

        this->AddInstr(
            IR::Instr::New(
                Js::OpCode::Ld_A,
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetParamClosureReg()),
                localClosureOpnd,
                this->m_func),
            offset);

        // Create a new local closure for the body when either body scope has scope slots allocated or
        // eval is present which can leak declarations.
        if (this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() > 0 || this->m_func->GetJITFunctionBody()->HasScopeObject())
        {
            if (this->m_func->GetJITFunctionBody()->HasScopeObject())
            {
                if (this->m_func->GetJITFunctionBody()->HasCachedScopePropIds())
                {
                    this->BuildInitCachedScope(0, Js::Constants::NoByteCodeOffset);
                }
                else
                {
                    this->AddInstr(
                        IR::Instr::New(
                            Js::OpCode::NewScopeObject,
                            this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                            m_func),
                        Js::Constants::NoByteCodeOffset);
                }
            }
            else
            {
                this->AddInstr(
                    IR::Instr::New(
                        Js::OpCode::NewScopeSlots,
                        this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                        IR::IntConstOpnd::New(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() + Js::ScopeSlots::FirstSlotIndex, TyUint32, this->m_func),
                        m_func),
                    Js::Constants::NoByteCodeOffset);
            }

            IR::Instr* lfd = IR::Instr::New(
                Js::OpCode::LdFrameDisplay,
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg()),
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg()),
                this->m_func);
            this->AddInstr(
                lfd,
                Js::Constants::NoByteCodeOffset);
            lfd->isNonFastPathFrameDisplay = true;
        }
        break;
    }

    default:
        this->AddInstr(instr, offset);
        break;
    }
}